

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeBuffer.cpp
# Opt level: O0

NodeInfo *
anon_unknown.dwarf_15986::unpack_node(NodeInfo *__return_storage_ptr__,uchar *buf,size_t *inc)

{
  uint64_t uVar1;
  cali_attr_type local_64;
  NodeInfo *ret;
  anon_union_8_7_33918203_for_value local_48;
  cali_attr_type local_3c;
  uint64_t uStack_38;
  cali_attr_type type;
  size_t size;
  uint64_t uStack_28;
  bool have_parent;
  uint64_t u;
  size_t pos;
  size_t *inc_local;
  uchar *buf_local;
  
  __return_storage_ptr__->node_id = 0xffffffffffffffff;
  __return_storage_ptr__->attr_id = 0xffffffffffffffff;
  __return_storage_ptr__->parent_id = 0xffffffffffffffff;
  pos = (size_t)inc;
  inc_local = (size_t *)buf;
  cali::Variant::Variant(&__return_storage_ptr__->value);
  u = 0;
  uStack_28 = vldec_u64((uchar *)inc_local,&u);
  size._7_1_ = (uStack_28 & 1) == 1;
  __return_storage_ptr__->node_id = uStack_28 >> 1;
  uVar1 = vldec_u64((uchar *)((long)inc_local + u),&u);
  __return_storage_ptr__->attr_id = uVar1;
  if ((size._7_1_ & 1) != 0) {
    uVar1 = vldec_u64((uchar *)((long)inc_local + u),&u);
    __return_storage_ptr__->parent_id = uVar1;
  }
  uStack_28 = vldec_u64((uchar *)((long)inc_local + u),&u);
  uStack_38 = vldec_u64((uchar *)((long)inc_local + u),&u);
  if (uStack_28 < 10) {
    local_64 = (cali_attr_type)uStack_28;
  }
  else {
    local_64 = CALI_TYPE_INV;
  }
  local_3c = local_64;
  cali::Variant::Variant((Variant *)&ret,local_64,(void *)((long)inc_local + u),uStack_38);
  (__return_storage_ptr__->value).m_v.type_and_size = (uint64_t)ret;
  (__return_storage_ptr__->value).m_v.value = local_48;
  *(uint64_t *)pos = uStack_38 + u + *(long *)pos;
  return __return_storage_ptr__;
}

Assistant:

NodeBuffer::NodeInfo unpack_node(const unsigned char* buf, size_t* inc)
{
    NodeBuffer::NodeInfo ret = { CALI_INV_ID, CALI_INV_ID, CALI_INV_ID, Variant() };
    size_t               pos = 0;

    uint64_t u           = vldec_u64(buf + pos, &pos);
    bool     have_parent = ((u % 2) == 1);

    ret.node_id = u / 2;
    ret.attr_id = vldec_u64(buf + pos, &pos);

    if (have_parent)
        ret.parent_id = vldec_u64(buf + pos, &pos);

    u                   = vldec_u64(buf + pos, &pos);
    size_t         size = vldec_u64(buf + pos, &pos);
    cali_attr_type type = (u <= CALI_MAXTYPE ? static_cast<cali_attr_type>(u) : CALI_TYPE_INV);

    ret.value = Variant(type, buf + pos, size);

    pos += size;
    *inc += pos;

    return ret;
}